

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

void __thiscall
pbrt::Transform::Decompose(Transform *this,Vector3f *T,SquareMatrix<4> *R,SquareMatrix<4> *S)

{
  float *pfVar1;
  SquareMatrix<4> *__src;
  void *in_RCX;
  void *in_RDX;
  float *in_RSI;
  void *in_RDI;
  span<float> *psVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Float n;
  int i_1;
  SquareMatrix<4> Rnext;
  SquareMatrix<4> Rit;
  int count;
  Float norm;
  int i;
  SquareMatrix<4> M;
  SquareMatrix<4> *in_stack_00000578;
  int in_stack_fffffffffffffc9c;
  SquareMatrix<4> *in_stack_fffffffffffffca0;
  SquareMatrix<4> *in_stack_fffffffffffffca8;
  uint in_stack_fffffffffffffcb0;
  uint uVar6;
  float in_stack_fffffffffffffcb4;
  SquareMatrix<4> *in_stack_fffffffffffffcd0;
  SquareMatrix<4> *in_stack_fffffffffffffd18;
  SquareMatrix<4> *in_stack_fffffffffffffd20;
  undefined1 local_2d0 [64];
  span<float> local_290;
  span<float> local_280;
  span<float> local_270;
  span<float> local_260;
  span<float> local_250;
  span<float> local_240;
  float local_22c;
  int local_228;
  undefined1 local_1e4 [144];
  SquareMatrix<4> local_154;
  undefined1 local_110 [64];
  int local_d0;
  float local_cc;
  span<float> local_c8;
  span<float> local_b8;
  span<float> local_a8;
  int local_94;
  undefined1 local_90 [64];
  span<const_float> local_50;
  span<const_float> local_40;
  span<const_float> local_30;
  void *local_20;
  void *local_18;
  float *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = SquareMatrix<4>::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
  pfVar1 = pstd::span<const_float>::operator[](&local_30,3);
  *local_10 = *pfVar1;
  local_40 = SquareMatrix<4>::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
  pfVar1 = pstd::span<const_float>::operator[](&local_40,3);
  local_10[1] = *pfVar1;
  local_50 = SquareMatrix<4>::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
  pfVar1 = pstd::span<const_float>::operator[](&local_50,3);
  local_10[2] = *pfVar1;
  memcpy(local_90,in_RDI,0x40);
  for (local_94 = 0; local_94 < 3; local_94 = local_94 + 1) {
    local_a8 = SquareMatrix<4>::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
    pfVar1 = pstd::span<float>::operator[](&local_a8,(long)local_94);
    *pfVar1 = 0.0;
    local_b8 = SquareMatrix<4>::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
    pfVar1 = pstd::span<float>::operator[](&local_b8,3);
    *pfVar1 = 0.0;
  }
  local_c8 = SquareMatrix<4>::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
  pfVar1 = pstd::span<float>::operator[](&local_c8,3);
  *pfVar1 = 1.0;
  local_d0 = 0;
  memcpy(local_18,local_90,0x40);
  do {
    Transpose<4>(in_stack_fffffffffffffcd0);
    in_stack_fffffffffffffcd0 = &local_154;
    Inverse<4>(in_stack_00000578);
    __src = pstd::optional<pbrt::SquareMatrix<4>_>::operator*
                      ((optional<pbrt::SquareMatrix<4>_> *)0x57f084);
    memcpy(local_110,__src,0x40);
    pstd::optional<pbrt::SquareMatrix<4>_>::~optional((optional<pbrt::SquareMatrix<4>_> *)0x57f0af);
    SquareMatrix<4>::operator+
              ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               in_stack_fffffffffffffca8);
    SquareMatrix<4>::operator/
              ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (Float)((ulong)in_stack_fffffffffffffca8 >> 0x20));
    local_cc = 0.0;
    uVar6 = in_stack_fffffffffffffcb0;
    for (local_228 = 0; local_228 < 3; local_228 = local_228 + 1) {
      local_240 = SquareMatrix<4>::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      pfVar1 = pstd::span<float>::operator[](&local_240,0);
      in_stack_fffffffffffffcb4 = *pfVar1;
      local_250 = SquareMatrix<4>::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      psVar2 = &local_250;
      pfVar1 = pstd::span<float>::operator[](psVar2,0);
      fVar3 = in_stack_fffffffffffffcb4 - *pfVar1;
      std::abs((int)psVar2);
      local_260 = SquareMatrix<4>::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      pfVar1 = pstd::span<float>::operator[](&local_260,1);
      fVar4 = *pfVar1;
      local_270 = SquareMatrix<4>::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      psVar2 = &local_270;
      pfVar1 = pstd::span<float>::operator[](psVar2,1);
      fVar4 = fVar4 - *pfVar1;
      std::abs((int)psVar2);
      local_280 = SquareMatrix<4>::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      pfVar1 = pstd::span<float>::operator[](&local_280,2);
      fVar5 = *pfVar1;
      local_290 = SquareMatrix<4>::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      psVar2 = &local_290;
      pfVar1 = pstd::span<float>::operator[](psVar2,2);
      fVar5 = fVar5 - *pfVar1;
      std::abs((int)psVar2);
      local_22c = fVar3 + fVar4 + fVar5;
      pfVar1 = std::max<float>(&local_cc,&local_22c);
      local_cc = *pfVar1;
    }
    memcpy(local_18,local_1e4,0x40);
    local_d0 = local_d0 + 1;
    in_stack_fffffffffffffcb0 = uVar6 & 0xffffff;
    if (local_d0 < 100) {
      in_stack_fffffffffffffcb0 = CONCAT13(0.0001 < local_cc,(int3)uVar6);
    }
  } while ((char)(in_stack_fffffffffffffcb0 >> 0x18) != '\0');
  Inverse<4>(in_stack_00000578);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator*((optional<pbrt::SquareMatrix<4>_> *)0x57f3ae);
  pbrt::operator*(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  memcpy(local_20,local_2d0,0x40);
  pstd::optional<pbrt::SquareMatrix<4>_>::~optional((optional<pbrt::SquareMatrix<4>_> *)0x57f3f5);
  return;
}

Assistant:

void Transform::Decompose(Vector3f *T, SquareMatrix<4> *R, SquareMatrix<4> *S) const {
    // Extract translation _T_ from transformation matrix
    T->x = m[0][3];
    T->y = m[1][3];
    T->z = m[2][3];

    // Compute new transformation matrix _M_ without translation
    SquareMatrix<4> M = m;
    for (int i = 0; i < 3; ++i)
        M[i][3] = M[3][i] = 0.f;
    M[3][3] = 1.f;

    // Extract rotation _R_ from transformation matrix
    Float norm;
    int count = 0;
    *R = M;
    do {
        // Compute next matrix _Rnext_ in series
        SquareMatrix<4> Rit = *Inverse(Transpose(*R));
        SquareMatrix<4> Rnext = (*R + Rit) / 2;

        // Compute norm of difference between _R_ and _Rnext_
        norm = 0;
        for (int i = 0; i < 3; ++i) {
            Float n = std::abs((*R)[i][0] - Rnext[i][0]) +
                      std::abs((*R)[i][1] - Rnext[i][1]) +
                      std::abs((*R)[i][2] - Rnext[i][2]);
            norm = std::max(norm, n);
        }

        *R = Rnext;
    } while (++count < 100 && norm > .0001);
    // XXX TODO FIXME deal with flip...

    // Compute scale _S_ using rotation and original matrix
    *S = *Inverse(*R) * M;
}